

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

void conf_set_str_str(Conf *conf,int primary,char *secondary,char *value)

{
  conf_entry *entry;
  char *pcVar1;
  
  entry = (conf_entry *)safemalloc(1,0x18,0);
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1c9,"void conf_set_str_str(Conf *, int, const char *, const char *)");
  }
  if (valuetypes[primary] == 3) {
    (entry->key).primary = primary;
    pcVar1 = dupstr(secondary);
    (entry->key).secondary.s = pcVar1;
    pcVar1 = dupstr(value);
    (entry->value).u.stringval = pcVar1;
    conf_insert(conf,entry);
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1ca,"void conf_set_str_str(Conf *, int, const char *, const char *)");
}

Assistant:

void conf_set_str_str(Conf *conf, int primary, const char *secondary,
                      const char *value)
{
    struct conf_entry *entry = snew(struct conf_entry);

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    entry->key.primary = primary;
    entry->key.secondary.s = dupstr(secondary);
    entry->value.u.stringval = dupstr(value);
    conf_insert(conf, entry);
}